

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaCom.c
# Opt level: O0

int Cba_CommandBlast(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Cba_Man_t *p_00;
  Gia_Man_t *pNew_00;
  char *pcVar2;
  uint local_44;
  uint local_40;
  int fVerbose;
  int fSeq;
  int c;
  Cba_Man_t *p;
  Gia_Man_t *pNew;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  p_00 = Cba_AbcGetMan(pAbc);
  local_40 = 0;
  local_44 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"svh");
    if (iVar1 == -1) {
      if (p_00 == (Cba_Man_t *)0x0) {
        Abc_Print(1,"Cba_CommandBlast(): There is no current design.\n");
      }
      else {
        pNew_00 = Cba_ManBlast(p_00,0,local_40,local_44);
        if (pNew_00 == (Gia_Man_t *)0x0) {
          Abc_Print(1,"Cba_CommandBlast(): Bit-blasting has failed.\n");
        }
        else {
          Abc_FrameUpdateGia(pAbc,pNew_00);
        }
      }
      return 0;
    }
    if (iVar1 == 0x68) break;
    if (iVar1 == 0x73) {
      local_40 = local_40 ^ 1;
    }
    else {
      if (iVar1 != 0x76) break;
      local_44 = local_44 ^ 1;
    }
  }
  Abc_Print(-2,"usage: %%blast [-svh]\n");
  Abc_Print(-2,"\t         performs bit-blasting of the word-level design\n");
  pcVar2 = "no";
  if (local_40 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-s     : toggle blasting sequential elements [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (local_44 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Cba_CommandBlast( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pNew = NULL;
    Cba_Man_t * p = Cba_AbcGetMan(pAbc);
    int c, fSeq = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "svh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fSeq ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Cba_CommandBlast(): There is no current design.\n" );
        return 0;
    }
    pNew = Cba_ManBlast( p, 0, fSeq, fVerbose );
    if ( pNew == NULL )
    {
        Abc_Print( 1, "Cba_CommandBlast(): Bit-blasting has failed.\n" );
        return 0;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;
usage:
    Abc_Print( -2, "usage: %%blast [-svh]\n" );
    Abc_Print( -2, "\t         performs bit-blasting of the word-level design\n" );
    Abc_Print( -2, "\t-s     : toggle blasting sequential elements [default = %s]\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}